

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O0

Result __thiscall
wabt::interp::Memory::AtomicRmwCmpxchg<unsigned_long>
          (Memory *this,u32 offset,u32 addend,unsigned_long expect,unsigned_long replace,
          unsigned_long *out)

{
  bool bVar1;
  Result RVar2;
  unsigned_long local_40;
  unsigned_long read;
  unsigned_long *out_local;
  unsigned_long replace_local;
  unsigned_long expect_local;
  u32 addend_local;
  u32 offset_local;
  Memory *this_local;
  
  read = (unsigned_long)out;
  out_local = (unsigned_long *)replace;
  replace_local = expect;
  expect_local._0_4_ = addend;
  expect_local._4_4_ = offset;
  _addend_local = this;
  RVar2 = AtomicLoad<unsigned_long>(this,offset,addend,&local_40);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    if (local_40 == replace_local) {
      RVar2 = AtomicStore<unsigned_long>
                        (this,expect_local._4_4_,(u32)expect_local,(unsigned_long)out_local);
      bVar1 = Failed(RVar2);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
    }
    *(unsigned_long *)read = local_40;
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result Memory::AtomicRmwCmpxchg(u32 offset,
                                u32 addend,
                                T expect,
                                T replace,
                                T* out) {
  T read;
  CHECK_RESULT(AtomicLoad(offset, addend, &read));
  if (read == expect) {
    CHECK_RESULT(AtomicStore(offset, addend, replace));
  }
  *out = read;
  return Result::Ok;
}